

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLExportVisitor::visit_(IDLExportVisitor *this,Enum *type)

{
  ostream *poVar1;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  char (*in_RCX) [3];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  symbols;
  string sStack_68;
  string local_48;
  
  poVar1 = std::operator<<((ostream *)&this->m_stream,(string *)&this->m_indent);
  poVar1 = std::operator<<(poVar1,"enum ");
  Typelib::Type::getBasename_abi_cxx11_();
  stripLeadingUnderscore(&sStack_68,&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_68);
  std::operator<<(poVar1," { ");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  local_48.field_2._M_allocated_capacity = 0;
  local_48._M_dataplus._M_p = (pointer)&local_48;
  local_48._M_string_length = (size_type)&local_48;
  lVar2 = Typelib::Enum::values_abi_cxx11_();
  for (p_Var3 = *(_Rb_tree_node_base **)(lVar2 + 0x18); p_Var3 != (_Rb_tree_node_base *)(lVar2 + 8);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    stripLeadingUnderscore(&sStack_68,(string *)(p_Var3 + 1));
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  boost::algorithm::
  join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
            (&sStack_68,(algorithm *)&local_48,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)", ",in_RCX);
  poVar1 = std::operator<<((ostream *)&this->m_stream,(string *)&sStack_68);
  std::operator<<(poVar1," };\n");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
  return true;
}

Assistant:

bool IDLExportVisitor::visit_ (Enum const& type)
    {
        m_stream << m_indent << "enum " << stripLeadingUnderscore(type.getBasename()) << " { ";

        list<string> symbols;
        Enum::ValueMap const& values = type.values();
        Enum::ValueMap::const_iterator it, end = values.end();
        for (it = values.begin(); it != end; ++it)
            symbols.push_back(stripLeadingUnderscore(it->first));
        m_stream << join(symbols, ", ") << " };\n";

        return true;
    }